

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Struct * __thiscall iqxmlrpc::Value::cast<iqxmlrpc::Struct>(Value *this)

{
  Bad_cast *this_00;
  Struct *local_38;
  Struct *t;
  Value *this_local;
  
  if (this->value == (Value_type *)0x0) {
    local_38 = (Struct *)0x0;
  }
  else {
    local_38 = (Struct *)__dynamic_cast(this->value,&Value_type::typeinfo,&Struct::typeinfo,0);
  }
  if (local_38 == (Struct *)0x0) {
    this_00 = (Bad_cast *)__cxa_allocate_exception(0x18);
    Bad_cast::Bad_cast(this_00);
    __cxa_throw(this_00,&Bad_cast::typeinfo,Bad_cast::~Bad_cast);
  }
  return local_38;
}

Assistant:

T* Value::cast() const
{
  T* t = dynamic_cast<T*>( value );
  if( !t )
    throw Bad_cast();
  return t;
}